

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_normalize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  int iVar1;
  undefined1 local_58 [8];
  mbedtls_mpi ZZi;
  mbedtls_mpi Zi;
  int ret;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  iVar1 = mbedtls_mpi_cmp_int(&pt->Z,0);
  if (iVar1 == 0) {
    grp_local._4_4_ = 0;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)&ZZi.p);
    mbedtls_mpi_init((mbedtls_mpi *)local_58);
    Zi.p._4_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&ZZi.p,&pt->Z,&grp->P);
    if ((((Zi.p._4_4_ == 0) &&
         (Zi.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_58,(mbedtls_mpi *)&ZZi.p,
                                           (mbedtls_mpi *)&ZZi.p), Zi.p._4_4_ == 0)) &&
        (Zi.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,(mbedtls_mpi *)local_58),
        Zi.p._4_4_ == 0)) &&
       ((Zi.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,(mbedtls_mpi *)local_58),
        Zi.p._4_4_ == 0 &&
        (Zi.p._4_4_ = mbedtls_mpi_mul_mod(grp,&pt->Y,&pt->Y,(mbedtls_mpi *)&ZZi.p), Zi.p._4_4_ == 0)
        ))) {
      Zi.p._4_4_ = mbedtls_mpi_lset(&pt->Z,1);
    }
    mbedtls_mpi_free((mbedtls_mpi *)&ZZi.p);
    mbedtls_mpi_free((mbedtls_mpi *)local_58);
    grp_local._4_4_ = Zi.p._4_4_;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_normalize_jac( const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi Zi, ZZi;

    if( mbedtls_mpi_cmp_int( &pt->Z, 0 ) == 0 )
        return( 0 );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_normalize_jac( grp, pt ) );
#endif /* MBEDTLS_ECP_NORMALIZE_JAC_ALT */

    mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * X = X / Z^2  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &Zi,      &pt->Z,     &grp->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ZZi,     &Zi,        &Zi     ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->X,   &pt->X,     &ZZi    ) );

    /*
     * Y = Y / Z^3  mod p
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &ZZi    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &pt->Y,   &pt->Y,     &Zi     ) );

    /*
     * Z = 1
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &pt->Z, 1 ) );

cleanup:

    mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );

    return( ret );
}